

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O2

void __thiscall
cbtDbvt::collideTVNoStackAlloc
          (cbtDbvt *this,cbtDbvtNode *root,cbtDbvtVolume *vol,cbtNodeStack *stack,ICollide *policy)

{
  cbtDbvtNode *a;
  bool bVar1;
  int iVar2;
  cbtDbvtNode *root_local;
  cbtDbvtNode *local_50;
  cbtDbvtVolume volume;
  
  if (root != (cbtDbvtNode *)0x0) {
    volume.mi.m_floats._0_8_ = *(undefined8 *)(vol->mi).m_floats;
    volume.mi.m_floats._8_8_ = *(undefined8 *)((vol->mi).m_floats + 2);
    volume.mx.m_floats._0_8_ = *(undefined8 *)(vol->mx).m_floats;
    volume.mx.m_floats._8_8_ = *(undefined8 *)((vol->mx).m_floats + 2);
    local_50 = (cbtDbvtNode *)0x0;
    root_local = root;
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::resize(stack,0,&local_50);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::reserve(stack,0x40);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::push_back(stack,&root_local);
    iVar2 = stack->m_size;
    do {
      a = stack->m_data[(long)iVar2 + -1];
      stack->m_size = iVar2 + -1;
      bVar1 = Intersect(&a->volume,&volume);
      if (bVar1) {
        if (*(long *)((long)&a->field_2 + 8) == 0) {
          (*policy->_vptr_ICollide[3])(policy,a);
        }
        else {
          cbtAlignedObjectArray<const_cbtDbvtNode_*>::push_back(stack,(a->field_2).childs);
          cbtAlignedObjectArray<const_cbtDbvtNode_*>::push_back(stack,(a->field_2).childs + 1);
        }
      }
      iVar2 = stack->m_size;
    } while (0 < iVar2);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTVNoStackAlloc(const cbtDbvtNode* root,
										  const cbtDbvtVolume& vol,
										  cbtNodeStack& stack,
										  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
	if (root)
	{
		ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
		volume(vol);
		stack.resize(0);
		stack.reserve(SIMPLE_STACKSIZE);
		stack.push_back(root);
		do
		{
			const cbtDbvtNode* n = stack[stack.size() - 1];
			stack.pop_back();
			if (Intersect(n->volume, volume))
			{
				if (n->isinternal())
				{
					stack.push_back(n->childs[0]);
					stack.push_back(n->childs[1]);
				}
				else
				{
					policy.Process(n);
				}
			}
		} while (stack.size() > 0);
	}
}